

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall bssl::SSLTranscript::HashBuffer(SSLTranscript *this,EVP_MD_CTX *ctx,EVP_MD *digest)

{
  char *d;
  int iVar1;
  pointer pbVar2;
  uint8_t *puVar3;
  size_t sVar4;
  undefined1 local_48 [8];
  CBS header;
  CBS buf;
  EVP_MD *digest_local;
  EVP_MD_CTX *ctx_local;
  SSLTranscript *this_local;
  
  iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)digest,(ENGINE *)0x0);
  if (iVar1 == 0) {
    this_local._7_1_ = false;
  }
  else if (((this->field_0x28 & 1) == 0) || (this->version_ < 0x304)) {
    pbVar2 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&this->buffer_);
    d = pbVar2->data;
    pbVar2 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&this->buffer_);
    iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,d,pbVar2->length);
    this_local._7_1_ = iVar1 != 0;
  }
  else {
    pbVar2 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&this->buffer_);
    if (pbVar2->length == 0) {
      this_local._7_1_ = true;
    }
    else {
      pbVar2 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&this->buffer_);
      puVar3 = (uint8_t *)pbVar2->data;
      pbVar2 = std::unique_ptr<buf_mem_st,_bssl::internal::Deleter>::operator->(&this->buffer_);
      CBS_init((CBS *)&header.len,puVar3,pbVar2->length);
      iVar1 = CBS_get_bytes((CBS *)&header.len,(CBS *)local_48,4);
      if ((iVar1 != 0) && (iVar1 = CBS_skip((CBS *)&header.len,8), iVar1 != 0)) {
        puVar3 = CBS_data((CBS *)local_48);
        sVar4 = CBS_len((CBS *)local_48);
        iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar3,sVar4);
        if (iVar1 != 0) {
          puVar3 = CBS_data((CBS *)&header.len);
          sVar4 = CBS_len((CBS *)&header.len);
          iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar3,sVar4);
          if (iVar1 != 0) {
            return true;
          }
        }
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SSLTranscript::HashBuffer(EVP_MD_CTX *ctx, const EVP_MD *digest) const {
  if (!EVP_DigestInit_ex(ctx, digest, nullptr)) {
    return false;
  }
  if (!is_dtls_ || version_ < TLS1_3_VERSION) {
    return EVP_DigestUpdate(ctx, buffer_->data, buffer_->length);
  }

  // If the version is DTLS 1.3 and we still have a buffer, then there should be
  // at most a single DTLSHandshake message in the buffer, for the ClientHello.
  // On the server side, the version (DTLS 1.3) and cipher suite are chosen in
  // response to the first ClientHello, and InitHash is called before that
  // ClientHello is added to the SSLTranscript, so the buffer is empty if this
  // SSLTranscript is on the server.
  if (buffer_->length == 0) {
    return true;
  }

  // On the client side, we can receive either a ServerHello or
  // HelloRetryRequest in response to the ClientHello. Regardless of which
  // message we receive, the client code calls InitHash before updating the
  // transcript with that message, so the ClientHello is the only message in the
  // buffer. In DTLS 1.3, we need to skip the message_seq, fragment_offset, and
  // fragment_length fields from the DTLSHandshake message in the buffer. The
  // structure of a DTLSHandshake message is as follows (RFC 9147, section 5.2):
  //
  //   struct {
  //       HandshakeType msg_type;    /* handshake type */
  //       uint24 length;             /* bytes in message */
  //       uint16 message_seq;        /* DTLS-required field */
  //       uint24 fragment_offset;    /* DTLS-required field */
  //       uint24 fragment_length;    /* DTLS-required field */
  //       select (msg_type) {
  //         /* omitted for brevity */
  //       } body;
  //   } DTLSHandshake;
  CBS buf, header;
  CBS_init(&buf, reinterpret_cast<uint8_t *>(buffer_->data), buffer_->length);
  if (!CBS_get_bytes(&buf, &header, 4) ||                             //
      !CBS_skip(&buf, 8) ||                                           //
      !EVP_DigestUpdate(ctx, CBS_data(&header), CBS_len(&header)) ||  //
      !EVP_DigestUpdate(ctx, CBS_data(&buf), CBS_len(&buf))) {
    return false;
  }
  return true;
}